

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O1

void __thiscall pbrt::Image::FlipY(Image *this)

{
  float fVar1;
  uchar uVar2;
  uint16_t uVar3;
  int iVar4;
  PixelFormat PVar5;
  uchar *puVar6;
  Half *pHVar7;
  float *pfVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  
  if (1 < (this->resolution).super_Tuple2<pbrt::Point2,_int>.y) {
    iVar9 = 0;
    iVar10 = -1;
    do {
      iVar13 = (this->resolution).super_Tuple2<pbrt::Point2,_int>.x;
      if (0 < iVar13) {
        iVar11 = 0;
        do {
          iVar4 = (int)(this->channelNames).nStored;
          if (0 < iVar4) {
            lVar12 = (long)((iVar9 * iVar13 + iVar11) * iVar4);
            lVar14 = (long)((((this->resolution).super_Tuple2<pbrt::Point2,_int>.y + iVar10) *
                             iVar13 + iVar11) * iVar4);
            lVar15 = 0;
            do {
              PVar5 = this->format;
              if (PVar5 == Float) {
                pfVar8 = (this->p32).ptr;
                fVar1 = pfVar8[lVar12];
                pfVar8[lVar12] = pfVar8[lVar14];
                pfVar8[lVar14] = fVar1;
              }
              else if (PVar5 == Half) {
                pHVar7 = (this->p16).ptr;
                uVar3 = pHVar7[lVar12].h;
                pHVar7[lVar12].h = pHVar7[lVar14].h;
                pHVar7[lVar14].h = uVar3;
              }
              else {
                if (PVar5 != U256) {
                  LogFatal(Fatal,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/image.cpp"
                           ,0x305,"unexpected format");
                }
                puVar6 = (this->p8).ptr;
                uVar2 = puVar6[lVar12];
                puVar6[lVar12] = puVar6[lVar14];
                puVar6[lVar14] = uVar2;
              }
              lVar15 = lVar15 + 1;
              lVar12 = lVar12 + 1;
              lVar14 = lVar14 + 1;
            } while (lVar15 < (int)(this->channelNames).nStored);
          }
          iVar11 = iVar11 + 1;
          iVar13 = (this->resolution).super_Tuple2<pbrt::Point2,_int>.x;
        } while (iVar11 < iVar13);
      }
      iVar9 = iVar9 + 1;
      iVar10 = iVar10 + -1;
    } while (iVar9 < (this->resolution).super_Tuple2<pbrt::Point2,_int>.y / 2);
  }
  return;
}

Assistant:

void Image::FlipY() {
    for (int y = 0; y < resolution.y / 2; ++y) {
        for (int x = 0; x < resolution.x; ++x) {
            size_t o1 = PixelOffset({x, y}), o2 = PixelOffset({x, resolution.y - 1 - y});
            for (int c = 0; c < NChannels(); ++c) {
                if (Is8Bit(format))
                    pstd::swap(p8[o1 + c], p8[o2 + c]);
                else if (Is16Bit(format))
                    pstd::swap(p16[o1 + c], p16[o2 + c]);
                else if (Is32Bit(format))
                    pstd::swap(p32[o1 + c], p32[o2 + c]);
                else
                    LOG_FATAL("unexpected format");
            }
        }
    }
}